

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexUniformTexelBuffer::logSubmit
          (RenderVertexUniformTexelBuffer *this,TestLog *log,size_t commandIndex)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  MessageBuilder local_198;
  
  this_00 = &local_198.m_str;
  local_198.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,":");
  iVar1 = (*(this->super_RenderPassCommand)._vptr_RenderPassCommand[2])(this);
  std::operator<<((ostream *)this_00,(char *)CONCAT44(extraout_var,iVar1));
  std::operator<<((ostream *)this_00," Render using buffer as uniform buffer.");
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void RenderVertexUniformTexelBuffer::logSubmit (TestLog& log, size_t commandIndex) const
{
	log << TestLog::Message << commandIndex << ":" << getName() << " Render using buffer as uniform buffer." << TestLog::EndMessage;
}